

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::WriteHeader(SingleFileBlockManager *this,DatabaseHeader header)

{
  optional_idx *this_00;
  FileBuffer *this_01;
  optional_idx *this_02;
  data_ptr_t pdVar1;
  MetadataManager *pMVar2;
  _Base_ptr p_Var3;
  DBConfig *pDVar4;
  pointer pFVar5;
  idx_t iVar6;
  Allocator *allocator_p;
  data_ptr_t __src;
  FatalException *this_03;
  long lVar7;
  idx_t *piVar8;
  idx_t *piVar9;
  __node_base *p_Var10;
  __node_base *p_Var11;
  byte bVar12;
  MetaBlockPointer MVar13;
  MainHeader in_stack_fffffffffffffe48;
  _Hash_node_base *local_150;
  MetadataManager *local_148;
  pthread_mutex_t *local_140;
  vector<duckdb::MetadataHandle,_true> free_list_blocks;
  MemoryStream serializer;
  vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_> local_b0;
  idx_t local_98 [13];
  
  bVar12 = 0;
  GetFreeListBlocks(&free_list_blocks,this);
  pMVar2 = BlockManager::GetMetadataManager(&this->super_BlockManager);
  MetadataManager::MarkBlocksAsModified(pMVar2);
  local_140 = (pthread_mutex_t *)&this->block_lock;
  ::std::mutex::lock((mutex *)&local_140->__data);
  header.iteration = this->iteration_count + 1;
  this->iteration_count = header.iteration;
  p_Var10 = &(this->modified_blocks)._M_h._M_before_begin;
  local_148 = pMVar2;
  while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
    ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &this->free_list,(long *)(p_Var10 + 1));
    ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &this->newly_freed_list,(long *)(p_Var10 + 1));
  }
  ::std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->modified_blocks)._M_h);
  if (free_list_blocks.super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>
      .super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl.
      super__Vector_impl_data._M_start ==
      free_list_blocks.super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>
      .super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    header.free_list = 0xffffffffffffffff;
  }
  else {
    local_b0.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_start =
         free_list_blocks.
         super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
         super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_b0.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         free_list_blocks.
         super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
         super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl
         .super__Vector_impl_data._M_finish;
    local_b0.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         free_list_blocks.
         super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
         super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    free_list_blocks.super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    free_list_blocks.super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    free_list_blocks.super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FreeListBlockWriter::FreeListBlockWriter
              ((FreeListBlockWriter *)&serializer,local_148,
               (vector<duckdb::MetadataHandle,_true> *)&local_b0);
    ::std::vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>::~vector
              (&local_b0);
    MVar13 = MetadataWriter::GetMetaBlockPointer((MetadataWriter *)&serializer);
    header.free_list = MVar13.block_pointer;
    local_150 = (_Hash_node_base *)
                (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    (**serializer.super_WriteStream._vptr_WriteStream)(&serializer,&local_150,8);
    for (p_Var3 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)::std::_Rb_tree_increment(p_Var3)) {
      local_150 = *(_Hash_node_base **)(p_Var3 + 1);
      (**serializer.super_WriteStream._vptr_WriteStream)(&serializer,&local_150,8);
    }
    local_150 = (_Hash_node_base *)(this->multi_use_blocks)._M_h._M_element_count;
    (**serializer.super_WriteStream._vptr_WriteStream)(&serializer,&local_150,8);
    p_Var11 = &(this->multi_use_blocks)._M_h._M_before_begin;
    while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
      local_150 = p_Var11[1]._M_nxt;
      (**serializer.super_WriteStream._vptr_WriteStream)(&serializer,&local_150,8);
      local_150 = (_Hash_node_base *)
                  CONCAT44(local_150._4_4_,
                           ((_Prime_rehash_policy *)(p_Var11 + 2))->_M_max_load_factor);
      (**serializer.super_WriteStream._vptr_WriteStream)(&serializer,&local_150,4);
    }
    pMVar2 = BlockManager::GetMetadataManager(&this->super_BlockManager);
    MetadataManager::Write(pMVar2,&serializer.super_WriteStream);
    MetadataWriter::Flush((MetadataWriter *)&serializer);
    FreeListBlockWriter::~FreeListBlockWriter((FreeListBlockWriter *)&serializer);
  }
  MetadataManager::Flush(local_148);
  header.block_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(this->max_block);
  this_00 = &(this->options).storage_version;
  header.serialization_compatibility = optional_idx::GetIndex(this_00);
  pDVar4 = DBConfig::Get(this->db);
  if ((pDVar4->options).checkpoint_abort != DEBUG_ABORT_AFTER_FREE_LIST_WRITE) {
    pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(&this->handle);
    FileHandle::Sync(pFVar5);
    this_01 = &this->header_buffer;
    FileBuffer::Clear(this_01);
    this_02 = &(this->options).version_number;
    iVar6 = optional_idx::GetIndex(this_02);
    if (iVar6 == 0x40) {
      iVar6 = optional_idx::GetIndex(this_00);
      if (3 < iVar6) {
        this_02->index = 0x41;
        local_98[0] = optional_idx::GetIndex(this_02);
        local_98[3] = 0;
        local_98[4] = 0;
        local_98[1] = 0;
        local_98[2] = 0;
        pdVar1 = (this->header_buffer).buffer;
        piVar8 = local_98;
        piVar9 = (idx_t *)&stack0xfffffffffffffe48;
        for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
          *piVar9 = *piVar8;
          piVar8 = piVar8 + (ulong)bVar12 * -2 + 1;
          piVar9 = piVar9 + (ulong)bVar12 * -2 + 1;
        }
        SerializeHeaderStructure<duckdb::MainHeader>(in_stack_fffffffffffffe48,pdVar1);
        ChecksumAndWrite(this,this_01,0,false);
        FileBuffer::Clear(this_01);
      }
    }
    allocator_p = Allocator::Get(this->db);
    MemoryStream::MemoryStream(&serializer,allocator_p,0x200);
    DatabaseHeader::Write(&header,&serializer.super_WriteStream);
    pdVar1 = (this->header_buffer).buffer;
    __src = MemoryStream::GetData(&serializer);
    iVar6 = MemoryStream::GetPosition(&serializer);
    switchD_016b0717::default(pdVar1,__src,iVar6);
    ChecksumAndWrite(this,this_01,(ulong)(this->active_header != '\x01') * 0x1000 + 0x1000,false);
    this->active_header = '\x01' - this->active_header;
    pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(&this->handle);
    FileHandle::Sync(pFVar5);
    TrimFreeBlocks(this);
    MemoryStream::~MemoryStream(&serializer);
    pthread_mutex_unlock(local_140);
    ::std::vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>::~vector
              (&free_list_blocks.
                super_vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>);
    return;
  }
  this_03 = (FatalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&serializer,
             "Checkpoint aborted after free list write because of PRAGMA checkpoint_abort flag",
             (allocator *)&local_150);
  FatalException::FatalException(this_03,(string *)&serializer);
  __cxa_throw(this_03,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::WriteHeader(DatabaseHeader header) {
	auto free_list_blocks = GetFreeListBlocks();

	// now handle the free list
	auto &metadata_manager = GetMetadataManager();
	// add all modified blocks to the free list: they can now be written to again
	metadata_manager.MarkBlocksAsModified();

	lock_guard<mutex> lock(block_lock);
	// set the iteration count
	header.iteration = ++iteration_count;

	for (auto &block : modified_blocks) {
		free_list.insert(block);
		newly_freed_list.insert(block);
	}
	modified_blocks.clear();

	if (!free_list_blocks.empty()) {
		// there are blocks to write, either in the free_list or in the modified_blocks
		// we write these blocks specifically to the free_list_blocks
		// a normal MetadataWriter will fetch blocks to use from the free_list
		// but since we are WRITING the free_list, this behavior is sub-optimal
		FreeListBlockWriter writer(metadata_manager, std::move(free_list_blocks));

		auto ptr = writer.GetMetaBlockPointer();
		header.free_list = ptr.block_pointer;

		writer.Write<uint64_t>(free_list.size());
		for (auto &block_id : free_list) {
			writer.Write<block_id_t>(block_id);
		}
		writer.Write<uint64_t>(multi_use_blocks.size());
		for (auto &entry : multi_use_blocks) {
			writer.Write<block_id_t>(entry.first);
			writer.Write<uint32_t>(entry.second);
		}
		GetMetadataManager().Write(writer);
		writer.Flush();
	} else {
		// no blocks in the free list
		header.free_list = DConstants::INVALID_INDEX;
	}
	metadata_manager.Flush();
	header.block_count = NumericCast<idx_t>(max_block);
	header.serialization_compatibility = options.storage_version.GetIndex();

	auto &config = DBConfig::Get(db);
	if (config.options.checkpoint_abort == CheckpointAbort::DEBUG_ABORT_AFTER_FREE_LIST_WRITE) {
		throw FatalException("Checkpoint aborted after free list write because of PRAGMA checkpoint_abort flag");
	}

	// We need to fsync BEFORE we write the header to ensure that all the previous blocks are written as well
	handle->Sync();

	header_buffer.Clear();
	// if we are upgrading the database from version 64 -> version 65, we need to re-write the main header
	if (options.version_number.GetIndex() == 64 && options.storage_version.GetIndex() >= 4) {
		// rewrite the main header
		options.version_number = 65;
		MainHeader main_header = ConstructMainHeader(options.version_number.GetIndex());
		SerializeHeaderStructure<MainHeader>(main_header, header_buffer.buffer);
		// now write the header to the file
		ChecksumAndWrite(header_buffer, 0);
		header_buffer.Clear();
	}

	// set the header inside the buffer
	MemoryStream serializer(Allocator::Get(db));
	header.Write(serializer);
	memcpy(header_buffer.buffer, serializer.GetData(), serializer.GetPosition());
	// now write the header to the file, active_header determines whether we write to h1 or h2
	// note that if active_header is h1 we write to h2, and vice versa
	ChecksumAndWrite(header_buffer, active_header == 1 ? Storage::FILE_HEADER_SIZE : Storage::FILE_HEADER_SIZE * 2);
	// switch active header to the other header
	active_header = 1 - active_header;
	//! Ensure the header write ends up on disk
	handle->Sync();
	// Release the free blocks to the filesystem.
	TrimFreeBlocks();
}